

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QStringList * __thiscall
QAccessibleComboBox::actionNames(QStringList *__return_storage_ptr__,QAccessibleComboBox *this)

{
  QString *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QString *)0x0;
  local_38.size = 0;
  pQVar1 = (QString *)QAccessibleActionInterface::showMenuAction();
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_38,0,pQVar1);
  QList<QString>::end((QList<QString> *)&local_38);
  pQVar1 = (QString *)QAccessibleActionInterface::pressAction();
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_38,local_38.size,pQVar1);
  QList<QString>::end((QList<QString> *)&local_38);
  (__return_storage_ptr__->d).d = local_38.d;
  (__return_storage_ptr__->d).ptr = local_38.ptr;
  (__return_storage_ptr__->d).size = local_38.size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAccessibleComboBox::actionNames() const
{
    return QStringList() << showMenuAction() << pressAction();
}